

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

bool __thiscall Core::dataCheck(Core *this)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  Core *local_18;
  Core *this_local;
  
  local_18 = this;
  Parsing::File::getContent_abi_cxx11_(&local_30,&this->_f);
  bVar1 = Parsing::Parser::checkHeaders(&this->_p,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Your UWU(s) aren\'t good!",&local_61);
    this_local._7_1_ = error(this,&local_60,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Core::dataCheck()
{
    if (!_p.checkHeaders(_f.getContent()))
        return error("Your UWU(s) aren't good!");
    return true;
}